

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_vfy.cc
# Opt level: O0

int internal_verify(X509_STORE_CTX *ctx)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  EVP_PKEY *r;
  EVP_PKEY *pkey;
  X509 *xs;
  X509 *xi;
  int n;
  X509_STORE_CTX *ctx_local;
  
  sVar3 = sk_X509_num(ctx->chain);
  iVar2 = (int)sVar3;
  ctx->error_depth = iVar2 + -1;
  xi._4_4_ = iVar2 + -1;
  xs = sk_X509_value(ctx->chain,(long)xi._4_4_);
  iVar1 = x509_check_issued_with_callback(ctx,xs,xs);
  pkey = (EVP_PKEY *)xs;
  if (iVar1 == 0) {
    if ((ctx->param->flags & 0x80000) != 0) goto LAB_00235fe6;
    if (xi._4_4_ < 1) {
      ctx->error = 0x15;
      ctx->current_cert = xs;
      iVar2 = call_verify_cb(0,ctx);
      return iVar2;
    }
    xi._4_4_ = iVar2 + -2;
    ctx->error_depth = xi._4_4_;
    pkey = (EVP_PKEY *)sk_X509_value(ctx->chain,(long)xi._4_4_);
  }
  while( true ) {
    if (xi._4_4_ < 0) {
      return 1;
    }
    ctx->error_depth = xi._4_4_;
    if (((X509 *)pkey != xs) || ((ctx->param->flags & 0x4000) != 0)) {
      r = (EVP_PKEY *)X509_get0_pubkey(xs);
      if (r == (EVP_PKEY *)0x0) {
        ctx->error = 6;
        ctx->current_cert = xs;
        iVar2 = call_verify_cb(0,ctx);
        if (iVar2 == 0) {
          return 0;
        }
      }
      else {
        iVar2 = X509_verify((X509 *)pkey,r);
        if (iVar2 < 1) {
          ctx->error = 7;
          ctx->current_cert = (X509 *)pkey;
          iVar2 = call_verify_cb(0,ctx);
          if (iVar2 == 0) {
            return 0;
          }
        }
      }
    }
LAB_00235fe6:
    iVar2 = check_cert_time(ctx,(X509 *)pkey);
    if (iVar2 == 0) break;
    ctx->current_cert = (X509 *)pkey;
    iVar2 = call_verify_cb(1,ctx);
    if (iVar2 == 0) {
      return 0;
    }
    xi._4_4_ = xi._4_4_ + -1;
    if (-1 < xi._4_4_) {
      xs = (X509 *)pkey;
      pkey = (EVP_PKEY *)sk_X509_value(ctx->chain,(long)xi._4_4_);
    }
  }
  return 0;
}

Assistant:

static int internal_verify(X509_STORE_CTX *ctx) {
  // TODO(davidben): This logic is incredibly confusing. Rewrite this:
  //
  // First, don't allow the verify callback to suppress
  // X509_V_ERR_UNABLE_TO_DECODE_ISSUER_PUBLIC_KEY, which will simplify the
  // signature check. Then replace jumping into the middle of the loop. It's
  // trying to ensure that all certificates see |check_cert_time|, then checking
  // the root's self signature when requested, but not breaking partial chains
  // in the process.
  int n = (int)sk_X509_num(ctx->chain);
  ctx->error_depth = n - 1;
  n--;
  X509 *xi = sk_X509_value(ctx->chain, n);
  X509 *xs;
  if (x509_check_issued_with_callback(ctx, xi, xi)) {
    xs = xi;
  } else {
    if (ctx->param->flags & X509_V_FLAG_PARTIAL_CHAIN) {
      xs = xi;
      goto check_cert;
    }
    if (n <= 0) {
      ctx->error = X509_V_ERR_UNABLE_TO_VERIFY_LEAF_SIGNATURE;
      ctx->current_cert = xi;
      return call_verify_cb(0, ctx);
    }
    n--;
    ctx->error_depth = n;
    xs = sk_X509_value(ctx->chain, n);
  }

  //      ctx->error=0;  not needed
  while (n >= 0) {
    ctx->error_depth = n;

    // Skip signature check for self signed certificates unless
    // explicitly asked for. It doesn't add any security and just wastes
    // time.
    if (xs != xi || (ctx->param->flags & X509_V_FLAG_CHECK_SS_SIGNATURE)) {
      EVP_PKEY *pkey = X509_get0_pubkey(xi);
      if (pkey == NULL) {
        ctx->error = X509_V_ERR_UNABLE_TO_DECODE_ISSUER_PUBLIC_KEY;
        ctx->current_cert = xi;
        if (!call_verify_cb(0, ctx)) {
          return 0;
        }
      } else if (X509_verify(xs, pkey) <= 0) {
        ctx->error = X509_V_ERR_CERT_SIGNATURE_FAILURE;
        ctx->current_cert = xs;
        if (!call_verify_cb(0, ctx)) {
          return 0;
        }
      }
    }

  check_cert:
    if (!check_cert_time(ctx, xs)) {
      return 0;
    }

    // The last error (if any) is still in the error value
    ctx->current_cert = xs;
    if (!call_verify_cb(1, ctx)) {
      return 0;
    }

    n--;
    if (n >= 0) {
      xi = xs;
      xs = sk_X509_value(ctx->chain, n);
    }
  }

  return 1;
}